

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

big_integer *
anon_unknown.dwarf_a16b::merge_all<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  AssertionResult *pAVar1;
  bool bVar2;
  pointer pbVar3;
  pointer a_00;
  char *in_R9;
  AssertHelper AStack_1e8;
  AssertionResult gtest_ar__1;
  AssertHelper local_1c0;
  big_integer local_1b8;
  AssertionResult gtest_ar_;
  big_integer ab;
  big_integer local_110;
  big_integer local_d8;
  big_integer b;
  big_integer a;
  
  a_00 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pbVar3 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (a_00 == pbVar3) {
    __assert_fail("!v.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                  ,0x2ae,"T (anonymous namespace)::merge_all(std::vector<T>) [T = big_integer]");
  }
  do {
    if ((ulong)(((long)pbVar3 - (long)a_00) / 0x38) < 2) {
      big_integer::big_integer(__return_storage_ptr__,a_00);
      return __return_storage_ptr__;
    }
    extract_random_element<big_integer>(&a,v);
    extract_random_element<big_integer>(&b,v);
    big_integer::big_integer(&local_d8,&a);
    operator*(&ab,&local_d8,&b);
    big_integer::~big_integer(&local_d8);
    big_integer::big_integer(&local_110,&ab);
    operator/(&local_1b8,&local_110,&a);
    gtest_ar_.success_ = operator==(&local_1b8,&b);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    big_integer::~big_integer(&local_1b8);
    big_integer::~big_integer(&local_110);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_1b8,(internal *)&gtest_ar_,(AssertionResult *)"ab / a == b",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_1e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                 ,0x2a5,(char *)local_1b8._0_8_);
      testing::internal::AssertHelper::operator=(&AStack_1e8,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&AStack_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
      pAVar1 = &gtest_ar_;
LAB_00118bac:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&pAVar1->message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      big_integer::big_integer((big_integer *)&gtest_ar_,&ab);
      operator/(&local_1b8,(big_integer *)&gtest_ar_,&b);
      bVar2 = operator==(&local_1b8,&a);
      gtest_ar__1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar__1.success_ = bVar2;
      big_integer::~big_integer(&local_1b8);
      big_integer::~big_integer((big_integer *)&gtest_ar_);
      if (!bVar2) {
        testing::Message::Message((Message *)&AStack_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_1b8,(internal *)&gtest_ar__1,(AssertionResult *)"ab / b == a",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                   ,0x2a6,(char *)local_1b8._0_8_);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&AStack_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        std::__cxx11::string::~string((string *)&local_1b8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&AStack_1e8);
        pAVar1 = &gtest_ar__1;
        goto LAB_00118bac;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__1.message_);
      std::vector<big_integer,_std::allocator<big_integer>_>::push_back(v,&ab);
    }
    big_integer::~big_integer(&ab);
    big_integer::~big_integer(&b);
    big_integer::~big_integer(&a);
    a_00 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
    pbVar3 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

T merge_all(std::vector<T> v)
    {
        assert(!v.empty());

        while (v.size() >= 2)
            merge_two(v);

        return v[0];
    }